

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

int envy_bios_parse_mem_train(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  envy_bios_mem_train *peVar8;
  envy_bios_mem_train_entry *peVar9;
  int local_34;
  int j;
  envy_bios_mem_train_entry *entry;
  int i;
  int err;
  envy_bios_mem_train *mt;
  envy_bios *bios_local;
  
  peVar8 = &(bios->mem).train;
  if (peVar8->offset == 0) {
    bios_local._4_4_ = 0;
  }
  else {
    iVar1 = bios_u8(bios,(uint)peVar8->offset,&(bios->mem).train.version);
    iVar2 = bios_u8(bios,peVar8->offset + 1,&(bios->mem).train.hlen);
    iVar3 = bios_u8(bios,peVar8->offset + 2,&(bios->mem).train.rlen);
    iVar4 = bios_u8(bios,peVar8->offset + 3,&(bios->mem).train.subentrylen);
    iVar5 = bios_u8(bios,peVar8->offset + 4,&(bios->mem).train.subentries);
    iVar6 = bios_u8(bios,peVar8->offset + 5,&(bios->mem).train.entriesnum);
    if (iVar6 == 0 && (iVar5 == 0 && (iVar4 == 0 && (iVar3 == 0 && (iVar2 == 0 && iVar1 == 0))))) {
      bios_u16(bios,peVar8->offset + 6,&(bios->mem).train.mclk);
      envy_bios_block(bios,(uint)peVar8->offset,
                      (uint)(bios->mem).train.hlen +
                      (uint)(bios->mem).train.rlen * (uint)(bios->mem).train.entriesnum,"MEM TRAIN",
                      -1);
      peVar9 = (envy_bios_mem_train_entry *)calloc((ulong)(bios->mem).train.entriesnum,0xc);
      (bios->mem).train.entries = peVar9;
      if ((bios->mem).train.entries == (envy_bios_mem_train_entry *)0x0) {
        bios_local._4_4_ = -0xc;
      }
      else {
        entry._4_4_ = 0;
        for (entry._0_4_ = 0; (int)entry < (int)(uint)(bios->mem).train.entriesnum;
            entry._0_4_ = (int)entry + 1) {
          peVar9 = (bios->mem).train.entries + (int)entry;
          peVar9->offset =
               peVar8->offset + (ushort)(bios->mem).train.hlen +
               ((ushort)(bios->mem).train.rlen +
               (ushort)(bios->mem).train.subentries * (ushort)(bios->mem).train.subentrylen) *
               (short)(int)entry;
          uVar7 = bios_u8(bios,(uint)peVar9->offset,&peVar9->u00);
          entry._4_4_ = uVar7 | entry._4_4_;
          if (8 < (bios->mem).train.subentries) {
            (bios->mem).train.subentries = '\b';
            fprintf(_stderr,"Error when parsing mem train: subentries = %d > %zu\n",
                    (ulong)(bios->mem).train.subentries,8);
            return -0xe;
          }
          for (local_34 = 0; local_34 < (int)(uint)(bios->mem).train.subentries;
              local_34 = local_34 + 1) {
            uVar7 = bios_u8(bios,(uint)peVar9->offset + local_34 + 1,peVar9->subentry + local_34);
            entry._4_4_ = uVar7 | entry._4_4_;
          }
          if (entry._4_4_ != 0) {
            return -0xe;
          }
        }
        (bios->mem).train.valid = '\x01';
        bios_local._4_4_ = 0;
      }
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int
envy_bios_parse_mem_train (struct envy_bios *bios) {
	struct envy_bios_mem_train *mt = &bios->mem.train;
	if (!mt->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, mt->offset, &mt->version);
	err |= bios_u8(bios, mt->offset+1, &mt->hlen);
	err |= bios_u8(bios, mt->offset+2, &mt->rlen);
	err |= bios_u8(bios, mt->offset+3, &mt->subentrylen);
	err |= bios_u8(bios, mt->offset+4, &mt->subentries);
	err |= bios_u8(bios, mt->offset+5, &mt->entriesnum);
	if (err)
		return -EFAULT;
	bios_u16(bios, mt->offset+6, &mt->mclk);

	envy_bios_block(bios, mt->offset, mt->hlen + mt->rlen * mt->entriesnum, "MEM TRAIN", -1);
	mt->entries = calloc(mt->entriesnum, sizeof *mt->entries);
	if (!mt->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < mt->entriesnum; i++) {
		struct envy_bios_mem_train_entry *entry = &mt->entries[i];
		entry->offset = mt->offset + mt->hlen + ((mt->rlen + mt->subentries * mt->subentrylen) * i);
		err |= bios_u8(bios, entry->offset, &entry->u00);
		if (mt->subentries > sizeof(entry->subentry)) {
			mt->subentries = sizeof(entry->subentry);
			ENVY_BIOS_ERR("Error when parsing mem train: subentries = %d > %zu\n", mt->subentries, sizeof(entry->subentry));
			return -EFAULT;
		}
		int j;
		for (j = 0; j < mt->subentries; j++) {
			err |= bios_u8(bios, entry->offset+j+1, &entry->subentry[j]);
		}
		if (err)
			return -EFAULT;
	}
	mt->valid = 1;
	return 0;
}